

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Link_type other;
  pointer *ppuVar1;
  int *piVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__dest;
  size_t *psVar3;
  __node_base_ptr *value;
  pointer pcVar4;
  Export *this;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  DataSegment *pDVar9;
  size_t sVar10;
  char *pcVar11;
  ElementSegment *pEVar12;
  uintptr_t uVar13;
  Expression *pEVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 *puVar18;
  MixedArena *this_00;
  _Base_ptr *pp_Var19;
  pointer puVar20;
  pointer puVar21;
  pointer puVar22;
  pointer puVar23;
  Module *pMVar24;
  pointer puVar25;
  pointer func;
  undefined8 uVar26;
  Module *pMVar27;
  char cVar28;
  bool bVar29;
  string *psVar30;
  mapped_type *pmVar31;
  Module *this_01;
  Function *pFVar32;
  Expression *pEVar33;
  __node_base_ptr p_Var34;
  undefined8 *puVar35;
  Global *pGVar36;
  Const *pCVar37;
  element_type *peVar38;
  _Rb_tree_node_base *p_Var39;
  _Rb_tree_node_base *p_Var40;
  ostream *poVar41;
  char *pcVar42;
  long lVar43;
  Function *pFVar44;
  long *plVar45;
  const_iterator cVar46;
  ModuleUtils *this_02;
  undefined4 *puVar47;
  Expression *value_00;
  Block *pBVar48;
  const_iterator cVar49;
  Function *pFVar50;
  long extraout_RDX;
  _Rb_tree_node_base *p_Var51;
  ulong uVar52;
  _Link_type p_Var53;
  _Head_base<0UL,_wasm::Module_*,_false> _Var54;
  _Link_type __p;
  __node_base_ptr *arguments;
  int iVar55;
  _Base_ptr p_Var56;
  Name *other_00;
  FeatureSet *func_00;
  Index *this_03;
  uint uVar57;
  pointer puVar58;
  size_t sVar59;
  Name newName;
  Name newName_00;
  Name NVar60;
  Name NVar61;
  Name NVar62;
  Name NVar63;
  Name NVar64;
  Name NVar65;
  Name NVar66;
  Name root;
  Name root_00;
  string_view sVar67;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar68;
  undefined1 auVar69 [16];
  IString IVar70;
  Name name;
  undefined1 local_1240 [8];
  ToolOptions options;
  Module wasm;
  CtorEvalExternalInterface interface;
  CtorEvalExternalInterface envInterface;
  undefined8 local_b18;
  undefined8 uStack_b10;
  code *local_b08;
  code *local_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  code *local_ae8;
  code *local_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  code *local_ac8;
  code *local_ac0;
  undefined1 local_ab0 [8];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keptExportsSet;
  __single_object export_;
  __node_base local_a68;
  __single_object *local_a60;
  undefined1 uStack_a58;
  undefined7 uStack_a57;
  undefined1 local_a50;
  undefined7 uStack_a4f;
  undefined1 local_a48;
  undefined2 uStack_a47;
  undefined1 uStack_a45;
  undefined4 uStack_a44;
  uint uStack_a40;
  undefined4 uStack_a3c;
  undefined4 uStack_a38;
  undefined4 local_a34;
  undefined8 local_a30;
  undefined4 uStack_a28;
  undefined4 uStack_a24;
  undefined8 *local_a20;
  undefined8 local_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined4 local_a00;
  undefined4 uStack_9fc;
  long local_9f8;
  undefined8 uStack_9f0;
  undefined8 *local_9e8;
  undefined8 local_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined4 local_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined7 uStack_9a8;
  undefined4 uStack_9a1;
  CustomSection *local_998;
  undefined8 local_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined4 local_978;
  undefined8 local_970;
  CustomSection aCStack_968 [7];
  undefined1 auStack_7b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  PassOptions ret;
  long *local_6c8 [2];
  long local_6b8 [2];
  long *local_6a8 [2];
  long local_698 [2];
  long *local_688 [2];
  long local_678 [2];
  long *local_668 [2];
  long local_658 [2];
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  long *local_588 [2];
  long local_578 [2];
  undefined1 local_568 [48];
  _Base_ptr *local_538;
  _Base_ptr p_Stack_530;
  _Base_ptr local_528;
  _Base_ptr local_520;
  _Base_ptr local_518;
  uchar local_510 [8];
  undefined1 auStack_508 [8];
  ModuleReader reader;
  undefined1 local_4e8 [16];
  element_type *local_4d8;
  HeapType HStack_4d0;
  __node_base_ptr local_4c8;
  __node_base local_380;
  undefined1 local_378 [16];
  undefined1 auStack_368 [8];
  FunctionScope scope;
  __node_base local_318 [2];
  __node_base *local_308 [2];
  __node_base local_2f8 [2];
  __buckets_ptr *local_2e8 [2];
  __buckets_ptr local_2d8 [2];
  undefined1 auStack_2c8 [8];
  Split ctors;
  undefined1 auStack_2a8 [8];
  Split keptExports;
  _Storage<wasm::Literals,_false> local_288;
  byte local_250;
  _Base_ptr local_248;
  shared_ptr<(anonymous_namespace)::EvallingModuleRunner> envInstance;
  LocalSet *local_228 [2];
  undefined1 local_218 [16];
  undefined1 auStack_208 [8];
  Literals params;
  undefined1 auStack_1c8 [8];
  Literals results;
  size_type *local_188;
  string WasmCtorEvalOption;
  vector<wasm::Literals,_std::allocator<wasm::Literals>_> appliedLocals;
  size_type *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  undefined1 auStack_118 [8];
  Builder builder_1;
  undefined1 local_108 [16];
  undefined1 auStack_f8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> localSets;
  __node_base local_d8;
  pointer pLStack_d0;
  Function *local_c8;
  pointer local_c0;
  __node_base_ptr p_Stack_b8;
  _Head_base<0UL,_wasm::Module_*,_false> local_b0;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> envModule;
  undefined1 local_a0 [16];
  _Base_ptr local_90;
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  linkedInstances;
  undefined1 local_3a;
  undefined1 local_39;
  bool emitBinary;
  Module *pMStack_38;
  bool debugInfo;
  
  auStack_7b8 = (undefined1  [8])0x0;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a = 1;
  local_39 = 0;
  ctors.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_2c8 = (undefined1  [8])0x0;
  ctors.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keptExports.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_2a8 = (undefined1  [8])0x0;
  keptExports.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188 = &WasmCtorEvalOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"wasm-ctor-eval options","");
  ppuVar1 = &wasm.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  options._352_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&options.enabledFeatures,"wasm-ctor-eval","");
  keptExportsSet._M_h._M_single_bucket = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&keptExportsSet._M_h._M_single_bucket,"Execute code at compile time","");
  ::wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_1240,(string *)&options.enabledFeatures,
             (string *)&keptExportsSet._M_h._M_single_bucket);
  if (keptExportsSet._M_h._M_single_bucket != &local_a68) {
    operator_delete(keptExportsSet._M_h._M_single_bucket,
                    (ulong)((long)&(local_a68._M_nxt)->_M_nxt + 1));
  }
  if ((pointer *)options._352_8_ != ppuVar1) {
    operator_delete((void *)options._352_8_,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  options._352_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"--output","");
  keptExportsSet._M_h._M_single_bucket = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&keptExportsSet._M_h._M_single_bucket,"-o","");
  auStack_508 = (undefined1  [8])&reader.skipFunctionBodies;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_508,"Output file (stdout if not specified)","");
  interface.seenDataStack.
  super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
  .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  envInterface.super_ExternalInterface._vptr_ExternalInterface = (_func_int **)0x0;
  envInterface.instance =
       (EvallingModuleRunner *)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:986:10)>
       ::_M_invoke;
  envInterface.wasm =
       (Module *)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:986:10)>
       ::_M_manager;
  psVar30 = (string *)
            ::wasm::Options::add
                      ((string *)local_1240,(string *)&options.enabledFeatures,
                       (string *)&keptExportsSet._M_h._M_single_bucket,(string *)auStack_508,
                       (Arguments)&local_188,(function *)0x1,(bool)((char)&interface + '0'));
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)&interface.wasm;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&wasm.tagsMap._M_h._M_single_bucket,"--emit-text","");
  piVar2 = &ret.shrinkLevel;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = SUB82(piVar2,0);
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = (undefined1)((ulong)piVar2 >> 0x10);
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = (undefined1)((ulong)piVar2 >> 0x18);
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)piVar2 >> 0x20);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &passes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"-S","");
  auStack_f8 = (undefined1  [8])
               &localSets.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_f8,"Emit text instead of binary for the output file","");
  scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  auStack_368 = (undefined1  [8])&local_3a;
  scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:995:10)>
                ::_M_invoke;
  scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:995:10)>
                ::_M_manager;
  psVar30 = (string *)
            ::wasm::Options::add
                      (psVar30,(string *)&wasm.tagsMap._M_h._M_single_bucket,
                       (string *)
                       &passes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)auStack_f8,
                       (Arguments)&local_188,(function *)0x0,SUB81(auStack_368,0));
  local_288._M_value.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
       (long)&local_288._M_value.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0 + 8
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"--debuginfo","");
  auStack_208 = (undefined1  [8])&params.super_SmallVector<wasm::Literal,_1UL>.fixed;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_208,"-g","");
  auStack_1c8 = (undefined1  [8])&results.super_SmallVector<wasm::Literal,_1UL>.fixed;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_1c8,"Emit names section and debug info","");
  keptExportsSet._M_h._M_buckets = (__buckets_ptr)0x0;
  local_ab0 = (undefined1  [8])&local_39;
  keptExportsSet._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1001:10)>
       ::_M_invoke;
  keptExportsSet._M_h._M_bucket_count =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1001:10)>
       ::_M_manager;
  psVar30 = (string *)
            ::wasm::Options::add
                      (psVar30,(string *)&local_288._M_value,(string *)auStack_208,
                       (string *)auStack_1c8,(Arguments)&local_188,(function *)0x0,
                       SUB81(local_ab0,0));
  local_90 = &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--ctors","");
  local_538 = &local_528;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"-c","");
  local_568._0_8_ = local_568 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_568,"Comma-separated list of global constructor functions to evaluate",
             "");
  ret.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_2c8;
  psVar30 = (string *)
            ::wasm::Options::add
                      (psVar30,(string *)&local_90,(string *)&local_538,(string *)local_568,
                       (Arguments)&local_188,(function *)0x1,(bool)((char)&ret + -0x60));
  local_140 = &input._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"--kept-exports","");
  auStack_118 = (undefined1  [8])local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_118,"-ke","");
  WasmCtorEvalOption.field_2._8_8_ =
       &appliedLocals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
        super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&WasmCtorEvalOption.field_2 + 8),
             "Comma-separated list of ctors whose exports we keep around even if we eval those ctors"
             ,"");
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_248 = (_Base_ptr)auStack_2a8;
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1017:7)>
       ::_M_manager;
  psVar30 = (string *)
            ::wasm::Options::add
                      (psVar30,(string *)&local_140,(string *)auStack_118,
                       (string *)(WasmCtorEvalOption.field_2._M_local_buf + 8),(Arguments)&local_188
                       ,(function *)0x1,SUB81(&local_248,0));
  local_228[0] = (LocalSet *)local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"--ignore-external-input","");
  local_b0._M_head_impl = (Module *)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"-ipi","");
  scope.currDelegateTarget.super_IString.str._M_str = (char *)local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&scope.currDelegateTarget.super_IString.str._M_str,
             "Assumes no env vars are to be read, stdin is empty, etc.","");
  local_b18 = 0;
  uStack_b10 = 0;
  local_b00 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1025:10)>
              ::_M_invoke;
  local_b08 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1025:10)>
              ::_M_manager;
  psVar30 = (string *)
            ::wasm::Options::add
                      (psVar30,(string *)local_228,(string *)&local_b0,
                       (string *)&scope.currDelegateTarget.super_IString.str._M_str,
                       (Arguments)&local_188,(function *)0x0,SUB81(&local_b18,0));
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"--quiet","");
  local_6c8[0] = local_6b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"-q","");
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e8,"Do not emit verbose logging about the eval process","");
  local_af8 = 0;
  uStack_af0 = 0;
  local_ae0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1033:10)>
              ::_M_invoke;
  local_ae8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1033:10)>
              ::_M_manager;
  psVar30 = (string *)
            ::wasm::Options::add
                      (psVar30,(string *)local_308,(string *)local_6c8,(string *)local_2e8,
                       (Arguments)&local_188,(function *)0x0,SUB81(&local_af8,0));
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"INFILE","");
  local_ad8 = 0;
  uStack_ad0 = 0;
  local_ac0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1036:21)>
              ::_M_invoke;
  local_ac8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1036:21)>
              ::_M_manager;
  ::wasm::Options::add_positional(psVar30,(Arguments)local_6a8,(function *)0x1);
  if (local_ac8 != (code *)0x0) {
    (*local_ac8)(&local_ad8,&local_ad8,3);
  }
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0],local_698[0] + 1);
  }
  if (local_ae8 != (code *)0x0) {
    (*local_ae8)(&local_af8,&local_af8,3);
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0],(long)local_2d8[0] + 1);
  }
  ppuVar1 = &wasm.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_6c8[0] != local_6b8) {
    operator_delete(local_6c8[0],local_6b8[0] + 1);
  }
  if (local_308[0] != local_2f8) {
    operator_delete(local_308[0],(ulong)((long)&(local_2f8[0]._M_nxt)->_M_nxt + 1));
  }
  if (local_b08 != (code *)0x0) {
    (*local_b08)(&local_b18,&local_b18,3);
  }
  if ((__node_base *)scope.currDelegateTarget.super_IString.str._M_str != local_318) {
    operator_delete(scope.currDelegateTarget.super_IString.str._M_str,
                    (ulong)((long)&(local_318[0]._M_nxt)->_M_nxt + 1));
  }
  if (local_b0._M_head_impl != (Module *)local_a0) {
    operator_delete(local_b0._M_head_impl,
                    (ulong)((long)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                                      *)local_a0._0_8_)->
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   )._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  if (local_228[0] != (LocalSet *)local_218) {
    operator_delete(local_228[0],local_218._0_8_ + 1);
  }
  if (envInstance.
      super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)envInstance.
              super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)(&local_248,&local_248,3);
  }
  if ((pointer *)WasmCtorEvalOption.field_2._8_8_ !=
      &appliedLocals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)WasmCtorEvalOption.field_2._8_8_,
                    (ulong)((long)&((appliedLocals.
                                     super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->
                                   super_SmallVector<wasm::Literal,_1UL>).usedFixed + 1));
  }
  if (auStack_118 != (undefined1  [8])local_108) {
    operator_delete((void *)auStack_118,(ulong)(local_108._0_8_ + 1));
  }
  if (local_140 != &input._M_string_length) {
    operator_delete(local_140,input._M_string_length + 1);
  }
  __dest = &ret.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  std::
  _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1007:10)>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  if ((undefined1 *)local_568._0_8_ != local_568 + 0x10) {
    operator_delete((void *)local_568._0_8_,
                    (ulong)&((_Rb_tree_impl<std::less<wasm::Name>,_true> *)local_568._16_8_)->
                            field_0x1);
  }
  if (local_538 != &local_528) {
    operator_delete(local_538,
                    (ulong)&((_Rb_tree_impl<std::less<wasm::Name>,_true> *)&local_528->_M_color)->
                            field_0x1);
  }
  if ((_Rb_tree_header *)local_90 != &linkedInstances._M_t._M_impl.super__Rb_tree_header) {
    operator_delete(local_90,linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1)
    ;
  }
  if (keptExportsSet._M_h._M_bucket_count != 0) {
    (*(code *)keptExportsSet._M_h._M_bucket_count)(local_ab0,local_ab0,3);
  }
  if (auStack_1c8 != (undefined1  [8])&results.super_SmallVector<wasm::Literal,_1UL>.fixed) {
    operator_delete((void *)auStack_1c8,
                    results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 + 1)
    ;
  }
  if (auStack_208 != (undefined1  [8])&params.super_SmallVector<wasm::Literal,_1UL>.fixed) {
    operator_delete((void *)auStack_208,
                    params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 + 1);
  }
  if ((undefined1 *)local_288._M_value.super_SmallVector<wasm::Literal,_1UL>.usedFixed !=
      (undefined1 *)
      ((long)&local_288._M_value.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0 + 8
      )) {
    operator_delete((void *)local_288._M_value.super_SmallVector<wasm::Literal,_1UL>.usedFixed,
                    local_288._16_8_ + 1);
  }
  if (scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>.
              _M_impl.super__Vector_impl_data._M_finish)(auStack_368,auStack_368,3);
  }
  if (auStack_f8 !=
      (undefined1  [8])
      &localSets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
       .super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_f8,
                    (long)localSets.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  puVar18 = (undefined1 *)
            CONCAT44(passes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     CONCAT13(passes.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_,
                              CONCAT12(passes.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_,
                                       passes.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_)));
  if ((int *)puVar18 != &ret.shrinkLevel) {
    operator_delete(puVar18,CONCAT44(ret.inlining.alwaysInlineMaxSize,ret.shrinkLevel) + 1);
  }
  if (wasm.tagsMap._M_h._M_single_bucket != (__node_base_ptr)&interface.wasm) {
    operator_delete(wasm.tagsMap._M_h._M_single_bucket,
                    (ulong)((long)&((interface.wasm)->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (envInterface.wasm != (Module *)0x0) {
    psVar3 = (size_t *)
             ((long)&interface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20);
    (*(code *)envInterface.wasm)(psVar3,psVar3,3);
  }
  if (auStack_508 != (undefined1  [8])&reader.skipFunctionBodies) {
    operator_delete((void *)auStack_508,(ulong)((char *)stack0xfffffffffffffb08 + 1));
  }
  if (keptExportsSet._M_h._M_single_bucket != &local_a68) {
    operator_delete(keptExportsSet._M_h._M_single_bucket,
                    (ulong)((long)&(local_a68._M_nxt)->_M_nxt + 1));
  }
  if ((pointer *)options._352_8_ != ppuVar1) {
    operator_delete((void *)options._352_8_,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  ::wasm::Options::parse((int)local_1240,(char **)(ulong)(uint)argc);
  options._352_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"infile","");
  pmVar31 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&options,(key_type *)&options.enabledFeatures);
  ::wasm::read_file<std::__cxx11::string>((string *)&local_140,(BinaryOption)pmVar31);
  if ((pointer *)options._352_8_ != ppuVar1) {
    operator_delete((void *)options._352_8_,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  ::wasm::Module::Module((Module *)&options.enabledFeatures);
  ::wasm::ToolOptions::applyFeatures((ToolOptions *)local_1240,(Module *)&options.enabledFeatures);
  if (local_1240[0] == (Options)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading...\n",0xb);
  }
  auStack_508._2_6_ = auStack_508._2_6_ & 0xffff;
  reader._0_8_ = reader._0_8_ & 0xffffffffffffff00;
  auStack_508._0_2_ = 1;
  keptExportsSet._M_h._M_single_bucket = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&keptExportsSet._M_h._M_single_bucket,"infile","");
  pmVar31 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&options,(key_type *)&keptExportsSet._M_h._M_single_bucket);
  pcVar4 = (pmVar31->_M_dataplus)._M_p;
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_688,pcVar4,pcVar4 + pmVar31->_M_string_length);
  local_668[0] = local_658;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"");
  ::wasm::ModuleReader::read(auStack_508,local_688,&options.enabledFeatures,local_668);
  if (local_668[0] != local_658) {
    operator_delete(local_668[0],local_658[0] + 1);
  }
  if (local_688[0] != local_678) {
    operator_delete(local_688[0],local_678[0] + 1);
  }
  if (keptExportsSet._M_h._M_single_bucket != &local_a68) {
    operator_delete(keptExportsSet._M_h._M_single_bucket,
                    (ulong)((long)&(local_a68._M_nxt)->_M_nxt + 1));
  }
  cVar28 = ::wasm::WasmValidator::validate
                     ((Module *)&keptExportsSet._M_h._M_single_bucket,(int)&options + 0x160);
  if (cVar28 == '\0') {
    poVar41 = (ostream *)std::operator<<((ostream *)&std::cout,(Module *)&options.enabledFeatures);
    keptExportsSet._M_h._M_single_bucket =
         (__node_base_ptr)CONCAT71(keptExportsSet._M_h._M_single_bucket._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar41,(char *)&keptExportsSet._M_h._M_single_bucket,1);
    ::wasm::Fatal::Fatal((Fatal *)&keptExportsSet._M_h._M_single_bucket);
    ::wasm::Fatal::operator<<
              ((Fatal *)&keptExportsSet._M_h._M_single_bucket,
               (char (*) [26])"error in validating input");
    goto LAB_0011c389;
  }
  cVar28 = ::wasm::MemoryUtils::flatten((Module *)&options.enabledFeatures);
  if (cVar28 == '\0') {
    if ((anonymous_namespace)::quiet == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  ...stopping since could not flatten memory\n",0x2d);
    }
    goto LAB_0011b69b;
  }
  arguments = &keptExportsSet._M_h._M_single_bucket;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_ab0,auStack_2a8,
             keptExports.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0,arguments,auStack_508,
             (size_t *)
             ((long)&interface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&linkedInstances;
  linkedInstances._M_t._M_impl._0_4_ = 0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  this_01 = (Module *)operator_new(0x348);
  memset(this_01,0,0x348);
  ::wasm::Module::Module(this_01);
  local_b0._M_head_impl = this_01;
  sVar67 = (string_view)::wasm::IString::interned(3,"env",0);
  (this_01->name).super_IString.str = sVar67;
  puVar20 = (pointer)wasm.globals.
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  puVar21 = wasm.dataSegments.
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pMStack_38 = this_01;
  if (wasm.exports.
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pointer)wasm.functions.
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &this_01->allocator;
    puVar58 = wasm.exports.
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      this = (puVar58->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if ((*(char **)&this->kind != (char *)0x0) &&
         (*(char **)&this->kind == (this_01->name).super_IString.str._M_str)) {
        auVar69._8_8_ = 0;
        auVar69._0_8_ = arguments;
        pFVar32 = ::wasm::ModuleUtils::copyFunction
                            ((ModuleUtils *)this,(Function *)this_01,(Module *)0x0,
                             (Name)(auVar69 << 0x40));
        (pFVar32->super_Importable).base.super_IString.str._M_len = 0;
        (pFVar32->super_Importable).base.super_IString.str._M_str = (char *)0x0;
        (pFVar32->super_Importable).module.super_IString.str._M_len = 0;
        (pFVar32->super_Importable).module.super_IString.str._M_str = (char *)0x0;
        pEVar33 = (Expression *)MixedArena::allocSpace(this_00,0x10,8);
        pEVar33->_id = UnreachableId;
        (pEVar33->type).id = 1;
        pFVar32->body = pEVar33;
        p_Var5 = *(_Hash_node_base **)&this[1].name.super_IString;
        p_Var6 = *(_Hash_node_base **)((long)&this[1].name.super_IString + 8);
        p_Var7 = (_Hash_node_base *)
                 (pFVar32->super_Importable).super_Named.name.super_IString.str._M_len;
        p_Var8 = (_Hash_node_base *)
                 (pFVar32->super_Importable).super_Named.name.super_IString.str._M_str;
        keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)operator_new(0x28);
        this_01 = pMStack_38;
        keptExportsSet._M_h._M_single_bucket[4]._M_nxt = (_Hash_node_base *)0x0;
        (keptExportsSet._M_h._M_single_bucket)->_M_nxt = p_Var5;
        keptExportsSet._M_h._M_single_bucket[1]._M_nxt = p_Var6;
        keptExportsSet._M_h._M_single_bucket[2]._M_nxt = p_Var7;
        keptExportsSet._M_h._M_single_bucket[3]._M_nxt = p_Var8;
        ::wasm::Module::addExport((unique_ptr *)pMStack_38);
        if (keptExportsSet._M_h._M_single_bucket != (__node_base_ptr)0x0) {
          operator_delete(keptExportsSet._M_h._M_single_bucket,0x28);
        }
      }
      puVar58 = puVar58 + 1;
      puVar20 = (pointer)wasm.globals.
                         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      puVar21 = wasm.dataSegments.
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    } while (puVar58 !=
             (pointer)wasm.functions.
                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  }
  for (; puVar22 = wasm.functions.
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
      puVar23 = wasm.memories.
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start, pMVar27 = local_b0._M_head_impl,
      pMVar24 = pMStack_38,
      puVar21 !=
      (pointer)wasm.tables.
               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; puVar21 = puVar21 + 1) {
    pDVar9 = (puVar21->_M_t).
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    pcVar42 = *(char **)((long)&(pDVar9->memory).super_IString + 8);
    wasm.globals.
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
    if ((pcVar42 != (char *)0x0) && (pcVar42 == (this_01->name).super_IString.str._M_str)) {
      p_Var34 = (__node_base_ptr)operator_new(0x50);
      p_Var34[8]._M_nxt = (_Hash_node_base *)0x0;
      p_Var34[9]._M_nxt = (_Hash_node_base *)0x0;
      p_Var34[6]._M_nxt = (_Hash_node_base *)0x0;
      p_Var34[7]._M_nxt = (_Hash_node_base *)0x0;
      p_Var34[4]._M_nxt = (_Hash_node_base *)0x0;
      p_Var34[5]._M_nxt = (_Hash_node_base *)0x0;
      p_Var34[2]._M_nxt = (_Hash_node_base *)0x0;
      p_Var34[3]._M_nxt = (_Hash_node_base *)0x0;
      p_Var34->_M_nxt = (_Hash_node_base *)0x0;
      p_Var34[1]._M_nxt = (_Hash_node_base *)0x0;
      p_Var34[8]._M_nxt = (_Hash_node_base *)0xffffffff;
      ::wasm::Type::Type((Type *)(p_Var34 + 9),(HeapType)0x1,Nullable);
      p_Var5 = *(_Hash_node_base **)((long)&(pDVar9->super_Named).name + 8);
      p_Var34->_M_nxt = *(_Hash_node_base **)&(pDVar9->super_Named).name;
      p_Var34[1]._M_nxt = p_Var5;
      *(bool *)&p_Var34[2]._M_nxt = (pDVar9->super_Named).hasExplicitName;
      p_Var34[9]._M_nxt =
           *(_Hash_node_base **)
            ((long)&(pDVar9->data).super__Vector_base<char,_std::allocator<char>_> + 0x10);
      p_Var5 = *(_Hash_node_base **)((long)&(pDVar9->memory).super_IString + 8);
      p_Var34[3]._M_nxt = *(_Hash_node_base **)&(pDVar9->memory).super_IString.str;
      p_Var34[4]._M_nxt = p_Var5;
      pEVar33 = pDVar9->offset;
      p_Var34[5]._M_nxt = *(_Hash_node_base **)&pDVar9->isPassive;
      p_Var34[6]._M_nxt = (_Hash_node_base *)pEVar33;
      p_Var34[7]._M_nxt =
           *(_Hash_node_base **)
            &(pDVar9->data).super__Vector_base<char,_std::allocator<char>_>._M_impl;
      p_Var34[8]._M_nxt =
           *(_Hash_node_base **)
            ((long)&(pDVar9->data).super__Vector_base<char,_std::allocator<char>_> + 8);
      keptExportsSet._M_h._M_single_bucket = p_Var34;
      puVar35 = (undefined8 *)::wasm::Module::addTable((unique_ptr *)pMStack_38);
      if (keptExportsSet._M_h._M_single_bucket != (__node_base_ptr)0x0) {
        operator_delete(keptExportsSet._M_h._M_single_bucket,0x50);
      }
      puVar35[5] = 0;
      puVar35[6] = 0;
      puVar35[3] = 0;
      puVar35[4] = 0;
      p_Var5 = *(_Hash_node_base **)&pDVar9->isPassive;
      pEVar33 = pDVar9->offset;
      p_Var6 = (_Hash_node_base *)*puVar35;
      p_Var7 = (_Hash_node_base *)puVar35[1];
      keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)operator_new(0x28);
      this_01 = pMStack_38;
      keptExportsSet._M_h._M_single_bucket[4]._M_nxt = (_Hash_node_base *)0x1;
      (keptExportsSet._M_h._M_single_bucket)->_M_nxt = p_Var5;
      keptExportsSet._M_h._M_single_bucket[1]._M_nxt = (_Hash_node_base *)pEVar33;
      keptExportsSet._M_h._M_single_bucket[2]._M_nxt = p_Var6;
      keptExportsSet._M_h._M_single_bucket[3]._M_nxt = p_Var7;
      ::wasm::Module::addExport((unique_ptr *)pMStack_38);
      if (keptExportsSet._M_h._M_single_bucket != (__node_base_ptr)0x0) {
        operator_delete(keptExportsSet._M_h._M_single_bucket,0x28);
      }
    }
    puVar20 = (pointer)wasm.globals.
                       super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; pMStack_38 = pMVar27,
      puVar25 = wasm.elementSegments.
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage, pMVar27 = local_b0._M_head_impl,
      puVar22 != puVar20; puVar22 = (pointer)((long)puVar22 + 8)) {
    pFVar32 = *(Function **)puVar22;
    pcVar42 = *(char **)((long)&(pFVar32->super_Importable).module + 8);
    wasm.memories.
    super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar23;
    if ((pcVar42 != (char *)0x0) &&
       (pcVar42 == *(char **)&((Name *)((long)this_01 + 0x118))->super_IString)) {
      pGVar36 = ::wasm::ModuleUtils::copyGlobal((Global *)pFVar32,this_01);
      (pGVar36->super_Importable).base.super_IString.str._M_len = 0;
      (pGVar36->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      (pGVar36->super_Importable).module.super_IString.str._M_len = 0;
      (pGVar36->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      auStack_508 = (undefined1  [8])pMStack_38;
      ::wasm::Literal::makeZero((Type)&keptExportsSet._M_h._M_single_bucket);
      value = &keptExportsSet._M_h._M_single_bucket;
      pCVar37 = ::wasm::Builder::makeConst((Builder *)auStack_508,(Literal *)value);
      pGVar36->init = (Expression *)pCVar37;
      ::wasm::Literal::~Literal((Literal *)value);
      sVar59 = (pFVar32->super_Importable).base.super_IString.str._M_len;
      pcVar42 = *(char **)((long)&(pFVar32->super_Importable).base + 8);
      sVar10 = (pGVar36->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar11 = (pGVar36->super_Importable).super_Named.name.super_IString.str._M_str;
      interface.seenDataStack.
      super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
      .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)operator_new(0x28);
      *(size_t *)
       (interface.seenDataStack.
        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20) = 3;
      *(size_t *)
       interface.seenDataStack.
       super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
       .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar59;
      *(char **)(interface.seenDataStack.
                 super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                 .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) = pcVar42;
      *(size_t *)
       (interface.seenDataStack.
        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10) = sVar10;
      *(char **)(interface.seenDataStack.
                 super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                 .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18) = pcVar11;
      ::wasm::Module::addExport((unique_ptr *)pMStack_38);
      this_01 = pMStack_38;
      if (interface.seenDataStack.
          super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
          .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        operator_delete((void *)interface.seenDataStack.
                                super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                                .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count,0x28);
        this_01 = pMStack_38;
      }
    }
    puVar23 = wasm.memories.
              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar27 = pMStack_38;
    pMVar24 = pMStack_38;
  }
  for (; pMStack_38 = pMVar27, puVar25 != (pointer)puVar23; puVar25 = (pointer)((long)puVar25 + 8))
  {
    pEVar12 = *(ElementSegment **)puVar25;
    if ((*(char **)(pEVar12 + 0x20) != (char *)0x0) &&
       (*(char **)(pEVar12 + 0x20) == *(char **)&((Name *)((long)this_01 + 0x118))->super_IString))
    {
      p_Var5 = *(_Hash_node_base **)pEVar12;
      p_Var6 = *(_Hash_node_base **)(pEVar12 + 8);
      keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)operator_new(0x58);
      keptExportsSet._M_h._M_single_bucket[8]._M_nxt = (_Hash_node_base *)0x0;
      keptExportsSet._M_h._M_single_bucket[9]._M_nxt = (_Hash_node_base *)0x0;
      keptExportsSet._M_h._M_single_bucket[6]._M_nxt = (_Hash_node_base *)0x0;
      keptExportsSet._M_h._M_single_bucket[7]._M_nxt = (_Hash_node_base *)0x0;
      keptExportsSet._M_h._M_single_bucket[4]._M_nxt = (_Hash_node_base *)0x0;
      keptExportsSet._M_h._M_single_bucket[5]._M_nxt = (_Hash_node_base *)0x0;
      keptExportsSet._M_h._M_single_bucket[2]._M_nxt = (_Hash_node_base *)0x0;
      keptExportsSet._M_h._M_single_bucket[3]._M_nxt = (_Hash_node_base *)0x0;
      (keptExportsSet._M_h._M_single_bucket)->_M_nxt = p_Var5;
      keptExportsSet._M_h._M_single_bucket[1]._M_nxt = p_Var6;
      *(ElementSegment *)&keptExportsSet._M_h._M_single_bucket[2]._M_nxt = pEVar12[0x10];
      keptExportsSet._M_h._M_single_bucket[7]._M_nxt = *(_Hash_node_base **)(pEVar12 + 0x38);
      keptExportsSet._M_h._M_single_bucket[8]._M_nxt = *(_Hash_node_base **)(pEVar12 + 0x40);
      *(ElementSegment *)&keptExportsSet._M_h._M_single_bucket[9]._M_nxt = pEVar12[0x48];
      keptExportsSet._M_h._M_single_bucket[10]._M_nxt = *(_Hash_node_base **)(pEVar12 + 0x50);
      puVar35 = (undefined8 *)::wasm::Module::addMemory((unique_ptr *)this_01);
      if (keptExportsSet._M_h._M_single_bucket != (__node_base_ptr)0x0) {
        operator_delete(keptExportsSet._M_h._M_single_bucket,0x58);
      }
      puVar35[5] = 0;
      puVar35[6] = 0;
      puVar35[3] = 0;
      puVar35[4] = 0;
      p_Var5 = *(_Hash_node_base **)(pEVar12 + 0x28);
      p_Var6 = *(_Hash_node_base **)(pEVar12 + 0x30);
      p_Var7 = (_Hash_node_base *)*puVar35;
      p_Var8 = (_Hash_node_base *)puVar35[1];
      keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)operator_new(0x28);
      this_01 = pMStack_38;
      keptExportsSet._M_h._M_single_bucket[4]._M_nxt = (_Hash_node_base *)0x2;
      (keptExportsSet._M_h._M_single_bucket)->_M_nxt = p_Var5;
      keptExportsSet._M_h._M_single_bucket[1]._M_nxt = p_Var6;
      keptExportsSet._M_h._M_single_bucket[2]._M_nxt = p_Var7;
      keptExportsSet._M_h._M_single_bucket[3]._M_nxt = p_Var8;
      ::wasm::Module::addExport((unique_ptr *)pMStack_38);
      if (keptExportsSet._M_h._M_single_bucket != (__node_base_ptr)0x0) {
        operator_delete(keptExportsSet._M_h._M_single_bucket,0x28);
      }
    }
    pMVar27 = pMStack_38;
    pMVar24 = pMStack_38;
  }
  local_520 = (_Base_ptr)&p_Stack_530;
  local_538 = (_Base_ptr *)0x0;
  p_Stack_530 = (_Base_ptr)0x0;
  local_528 = (_Base_ptr)0x0;
  local_510[0] = '\0';
  local_510[1] = '\0';
  local_510[2] = '\0';
  local_510[3] = '\0';
  local_510[4] = '\0';
  local_510[5] = '\0';
  local_510[6] = '\0';
  local_510[7] = '\0';
  p_Var53 = (_Link_type)&local_538;
  local_518 = local_520;
  pMStack_38 = pMVar24;
  anon_unknown.dwarf_4cba5::CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)
             ((long)&interface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)p_Var53);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)local_528,p_Var53);
  _Var54._M_head_impl = local_b0._M_head_impl;
  local_248 = (_Base_ptr)0x0;
  peVar38 = (element_type *)operator_new(0x2d0);
  (peVar38->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module = (Module *)0x100000001
  ;
  (peVar38->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00152c58;
  this_03 = &(peVar38->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxDepth;
  local_a60 = &export_;
  local_a68._M_nxt = (_Hash_node_base *)0x0;
  keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)0x0;
  export_._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
  super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
       (__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)0x0;
  uStack_a58 = SUB81(local_a60,0);
  uStack_a57 = (undefined7)((ulong)local_a60 >> 8);
  local_a50 = 0;
  uStack_a4f = 0;
  anon_unknown.dwarf_4cba5::EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)this_03,_Var54._M_head_impl,
             (ExternalInterface *)
             ((long)&interface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)&keptExportsSet._M_h._M_single_bucket);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)local_a68._M_nxt,(_Link_type)_Var54._M_head_impl);
  _Var54._M_head_impl = local_b0._M_head_impl;
  other_00 = &(local_b0._M_head_impl)->name;
  p_Var51 = (_Rb_tree_node_base *)&linkedInstances;
  p_Var56 = (_Base_ptr)linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  local_248 = (_Base_ptr)this_03;
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar38;
  if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
LAB_0011a3f3:
    bVar29 = true;
LAB_0011a3f6:
    p_Var39 = (_Rb_tree_node_base *)operator_new(0x40);
    p_Var53 = (_Link_type)(p_Var39 + 1);
    p_Var56 = (_Base_ptr)((_Var54._M_head_impl)->name).super_IString.str._M_str;
    *(size_t *)(p_Var39 + 1) = (other_00->super_IString).str._M_len;
    p_Var39[1]._M_parent = p_Var56;
    p_Var39[1]._M_left = (_Base_ptr)0x0;
    p_Var39[1]._M_right = (_Base_ptr)0x0;
    if (bVar29) {
      if ((linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)
         || (__p = p_Var53,
            bVar29 = ::wasm::IString::operator<
                               ((IString *)
                                (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_left + 1),(IString *)p_Var53), !bVar29)) {
LAB_0011a497:
        __p = p_Var53;
        pVar68 = std::
                 _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                 ::_M_get_insert_unique_pos
                           ((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                             *)&local_90,(key_type *)p_Var53);
      }
      else {
LAB_0011a4f4:
        auVar15._8_8_ = 0;
        auVar15._0_8_ = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pVar68 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar15 << 0x40);
      }
LAB_0011a4f7:
      p_Var51 = pVar68.first;
      if (pVar68.second == (_Rb_tree_node_base *)0x0) {
LAB_0011a536:
        std::
        _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
        ::_M_drop_node((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                        *)p_Var39,__p);
        goto LAB_0011a541;
      }
    }
    else {
      other = (_Link_type)(p_Var51 + 1);
      __p = other;
      bVar29 = ::wasm::IString::operator<((IString *)p_Var53,(IString *)other);
      if (!bVar29) {
        __p = p_Var53;
        bVar29 = ::wasm::IString::operator<((IString *)other,(IString *)p_Var53);
        if (bVar29) {
          if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var51)
          goto LAB_0011a4f4;
          p_Var40 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var51);
          __p = (_Link_type)(p_Var40 + 1);
          bVar29 = ::wasm::IString::operator<((IString *)p_Var53,(IString *)__p);
          if (!bVar29) goto LAB_0011a497;
          pVar68.second = p_Var40;
          pVar68.first = p_Var40;
          if (p_Var51->_M_right == (_Base_ptr)0x0) {
            auVar17._8_8_ = 0;
            auVar17._0_8_ = p_Var51;
            pVar68 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar17 << 0x40);
            goto LAB_0011a502;
          }
          goto LAB_0011a4f7;
        }
        goto LAB_0011a536;
      }
      pVar68.second = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      pVar68.first = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == p_Var51)
      goto LAB_0011a4f7;
      uVar52 = std::_Rb_tree_decrement(p_Var51);
      __p = p_Var53;
      bVar29 = ::wasm::IString::operator<((IString *)(uVar52 + 0x20),(IString *)p_Var53);
      if (!bVar29) goto LAB_0011a497;
      pVar68.second = p_Var51;
      pVar68.first = p_Var51;
      if (*(long *)(uVar52 + 0x18) != 0) goto LAB_0011a4f7;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar52;
      pVar68 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar16 << 0x40);
    }
LAB_0011a502:
    p_Var51 = pVar68.second;
    bVar29 = true;
    if ((pVar68.first == (_Rb_tree_node_base *)0x0) &&
       ((_Rb_tree_node_base *)&linkedInstances != p_Var51)) {
      bVar29 = ::wasm::IString::operator<((IString *)p_Var53,(IString *)(p_Var51 + 1));
    }
    std::_Rb_tree_insert_and_rebalance
              (bVar29,p_Var39,p_Var51,(_Rb_tree_node_base *)&linkedInstances);
    linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)
         ((long)&(linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color +
         1);
    p_Var51 = p_Var39;
  }
  else {
    do {
      p_Var40 = p_Var51;
      p_Var39 = p_Var56 + 1;
      bVar29 = ::wasm::IString::operator<((IString *)p_Var39,&other_00->super_IString);
      pp_Var19 = &p_Var56->_M_left;
      p_Var51 = p_Var56;
      if (bVar29) {
        p_Var51 = p_Var40;
      }
      p_Var56 = pp_Var19[bVar29];
    } while (pp_Var19[bVar29] != (_Base_ptr)0x0);
    if (p_Var51 == (_Rb_tree_node_base *)&linkedInstances) goto LAB_0011a3f3;
    if (bVar29) {
      p_Var39 = p_Var40 + 1;
    }
    bVar29 = ::wasm::IString::operator<(&other_00->super_IString,(IString *)p_Var39);
    if (bVar29) {
      bVar29 = false;
      goto LAB_0011a3f6;
    }
  }
LAB_0011a541:
  p_Var51[1]._M_left = local_248;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var51[1]._M_right,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&envInstance);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)local_568,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&local_90);
  p_Var53 = (_Link_type)local_568;
  anon_unknown.dwarf_4cba5::CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)&wasm.tagsMap._M_h._M_single_bucket,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)p_Var53);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)local_568._16_8_,p_Var53);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&ret.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&local_90);
  pcVar42 = (char *)&options.enabledFeatures;
  anon_unknown.dwarf_4cba5::EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)&keptExportsSet._M_h._M_single_bucket,(Module *)pcVar42,
             (ExternalInterface *)&wasm.tagsMap._M_h._M_single_bucket,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)&ret.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1007:10)>
                ::_M_manager,(_Link_type)pcVar42);
  pMStack_38 = (Module *)auStack_2c8;
  local_380._M_nxt =
       (_Hash_node_base *)
       ctors.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (auStack_2c8 !=
      (undefined1  [8])
      ctors.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      if ((anonymous_namespace)::quiet == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"trying to eval ",0xf);
        poVar41 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             ((_Alloc_hider *)&((_Base_ptr)pMStack_38)->_M_color)->_M_p,
                             (long)((_Base_ptr)pMStack_38)->_M_parent);
        auStack_508[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar41,auStack_508,1);
      }
      pcVar42 = (char *)::wasm::IString::interned
                                  (((_Base_ptr)pMStack_38)->_M_parent,
                                   ((_Alloc_hider *)&((_Base_ptr)pMStack_38)->_M_color)->_M_p,0);
      NVar60.super_IString.str._M_str = pcVar42;
      NVar60.super_IString.str._M_len = (size_t)&options.enabledFeatures;
      lVar43 = ::wasm::Module::getExportOrNull(NVar60);
      if (lVar43 == 0) {
        ::wasm::Fatal::Fatal((Fatal *)auStack_508);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&reader.skipFunctionBodies,"export not found: ",0x12);
        ::wasm::Fatal::operator<<
                  ((Fatal *)auStack_508,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pMStack_38);
        ::wasm::Fatal::~Fatal((Fatal *)auStack_508);
      }
      input.field_2._8_8_ = *(undefined8 *)(lVar43 + 0x10);
      pcVar11 = *(char **)(lVar43 + 0x18);
      auVar69 = ::wasm::IString::interned
                          (((_Base_ptr)pMStack_38)->_M_parent,
                           ((_Alloc_hider *)&((_Base_ptr)pMStack_38)->_M_color)->_M_p,0);
      params.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(uStack_a57,uStack_a58);
      NVar61.super_IString.str._M_str = (char *)input.field_2._8_8_;
      NVar61.super_IString.str._M_len =
           (size_t)params.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      pcVar42 = (char *)input.field_2._8_8_;
      local_378 = auVar69;
      pFVar32 = (Function *)::wasm::Module::getFunction(NVar61);
      lVar43 = ::wasm::Function::getNumParams();
      if ((lVar43 != 0) && ((anonymous_namespace)::ignoreExternalInput == '\0')) {
        if ((anonymous_namespace)::quiet == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  ...stopping due to params\n",0x1c);
          pcVar42 = "\n       recommendation: consider --ignore-external-input";
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "\n       recommendation: consider --ignore-external-input",0x38);
        }
        local_250 = 0;
LAB_0011b2c2:
        if ((anonymous_namespace)::quiet == '\0') {
          pcVar42 = "  ...stopping\n";
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  ...stopping\n",0xe);
        }
        std::_Optional_payload_base<wasm::Literals>::_M_reset
                  ((_Optional_payload_base<wasm::Literals> *)&local_288._M_value);
        break;
      }
      params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      params.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
      params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
      _M_str = (char *)0x0;
      auStack_208 = (undefined1  [8])0x0;
      params.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      params.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pFVar50 = (Function *)0x0;
      while( true ) {
        pFVar44 = (Function *)::wasm::Function::getNumParams();
        iVar55 = (int)pFVar50;
        if (pFVar44 <= pFVar50) break;
        pcVar42 = (char *)pFVar50;
        auStack_f8 = (undefined1  [8])::wasm::Function::getLocalType((uint)pFVar32);
        cVar28 = ::wasm::Type::isNonNullable();
        if (cVar28 != '\0') {
LAB_0011a7f8:
          if ((anonymous_namespace)::quiet == '\0') {
            pcVar42 = "  ...stopping due to non-zeroable param\n";
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  ...stopping due to non-zeroable param\n",0x28);
          }
          local_250 = 0;
          goto LAB_0011a820;
        }
        cVar28 = ::wasm::Type::isTuple();
        if (cVar28 != '\0') {
          auStack_508 = (undefined1  [8])auStack_f8;
          reader.super_ModuleIOBase.debugInfo = false;
          reader.DWARF = false;
          reader._2_2_ = 0;
          reader.profile = Normal;
          pFVar44 = (Function *)::wasm::Type::size();
          if (pFVar44 != (Function *)0x0) {
            do {
              plVar45 = (long *)::wasm::Type::Iterator::operator*((Iterator *)auStack_508);
              auStack_368 = (undefined1  [8])*plVar45;
              cVar28 = ::wasm::Type::isNonNullable();
              if (cVar28 != '\0') goto LAB_0011a7f8;
              pFVar50 = (Function *)(reader._0_8_ + 1);
              reader._0_8_ = pFVar50;
            } while ((pFVar50 != pFVar44) || (auStack_508 != (undefined1  [8])auStack_f8));
          }
        }
        ::wasm::Literal::makeZero((Type)auStack_508);
        ::wasm::SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_208,(Literal *)auStack_508);
        ::wasm::Literal::~Literal((Literal *)auStack_508);
        pFVar50 = (Function *)(ulong)(iVar55 + 1);
      }
      pEVar33 = pFVar32->body;
      if (pEVar33->_id == BlockId) {
        ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::FunctionScope::
        FunctionScope((FunctionScope *)auStack_368,pFVar32,(Literals *)auStack_208,
                      (EvallingModuleRunner *)&keptExportsSet._M_h._M_single_bucket);
        WasmCtorEvalOption.field_2._8_8_ = 0;
        appliedLocals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        appliedLocals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        results.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        results.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
        results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
        str._M_str = (char *)0x0;
        auStack_1c8 = (undefined1  [8])0x0;
        results.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        uVar13 = pEVar33[2].type.id;
        if (uVar13 == 0) {
LAB_0011b189:
          pcVar42 = auStack_1c8;
          std::_Optional_payload_base<wasm::Literals>::_Storage<wasm::Literals,false>::
          _Storage<wasm::Literals&>((_Storage<wasm::Literals,false> *)&local_288);
          local_250 = 1;
        }
        else {
          linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count = uVar13 - 1;
          sVar59 = 0;
          uVar52 = 0;
          do {
            if (pEVar33[2].type.id <= uVar52) goto LAB_0011b99f;
            local_4d8 = (element_type *)0x0;
            HStack_4d0.id = 0;
            local_4e8._0_8_ = (Module *)0x0;
            local_4e8._8_8_ = (Module *)0x0;
            stack0xfffffffffffffb08 = (code *)0x0;
            auStack_508 = (undefined1  [8])0x0;
            reader.super_ModuleIOBase.debugInfo = false;
            reader.DWARF = false;
            reader._2_2_ = 0;
            reader.profile = Normal;
            local_4c8 = (__node_base_ptr)0x0;
            ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                      ((Flow *)auStack_f8,
                       (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                       &keptExportsSet._M_h._M_single_bucket,
                       *(Expression **)(*(long *)(pEVar33 + 2) + uVar52 * 8));
            auStack_508 = auStack_f8;
            ::wasm::Literal::operator=((Literal *)&reader,(Literal *)&localSets);
            pFVar50 = local_c8;
            local_108._0_8_ = local_4d8;
            builder_1.wasm = (Module *)local_4e8._8_8_;
            auStack_118 = (undefined1  [8])local_4e8._0_8_;
            local_4d8 = (element_type *)local_c8;
            local_4e8._0_8_ = local_d8._M_nxt;
            local_4e8._8_8_ = pLStack_d0;
            local_d8._M_nxt = (_Hash_node_base *)0x0;
            pLStack_d0 = (pointer)0x0;
            local_c8 = (Function *)0x0;
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_118);
            HStack_4d0.id = (uintptr_t)local_c0;
            local_4c8 = p_Stack_b8;
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                       &stack0xffffffffffffff28);
            ::wasm::Literal::~Literal((Literal *)&localSets);
            anon_unknown.dwarf_4cba5::CtorEvalExternalInterface::applyToModule
                      ((CtorEvalExternalInterface *)&wasm.tagsMap._M_h._M_single_bucket);
            std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::operator=
                      ((vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)
                       ((long)&WasmCtorEvalOption.field_2 + 8),
                       (vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)auStack_368);
            auStack_1c8 = auStack_508;
            ::wasm::Literal::operator=((Literal *)&results,(Literal *)&reader);
            pcVar42 = local_4e8;
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator=
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                       &results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type,
                       (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)pcVar42);
            if (local_4c8 == (__node_base_ptr)0x0) {
              uVar57 = (int)sVar59 + 1;
              bVar29 = false;
            }
            else {
              if ((anonymous_namespace)::quiet == '\0') {
                pcVar42 = "  ...stopping in block due to break\n";
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  ...stopping in block due to break\n",0x24);
              }
              uVar57 = (uint)pEVar33[2].type.id;
              bVar29 = true;
            }
            sVar59 = (size_t)uVar57;
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_4e8);
            ::wasm::Literal::~Literal((Literal *)&reader);
            func = params.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          } while ((!bVar29) &&
                  (bVar29 = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                            uVar52, uVar52 = uVar52 + 1, bVar29));
          uVar52 = pEVar33[2].type.id;
          if (uVar57 == 0) {
            sVar59 = 0;
          }
          else if (sVar59 < uVar52) {
            reader.super_ModuleIOBase.debugInfo = false;
            reader.DWARF = false;
            reader._2_2_ = 0;
            reader.profile = Normal;
            auStack_508 = (undefined1  [8])
                          params.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
            stack0xfffffffffffffb08 =
                 std::
                 _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:72:11)>
                 ::_M_manager;
            root_00.super_IString.str._M_str = auStack_508;
            root_00.super_IString.str._M_len = (size_t)pcVar11;
            linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar59;
            IVar70.str = (string_view)
                         ::wasm::Names::getValidName
                                   ((Names *)input.field_2._8_8_,root_00,
                                    (function<bool_(wasm::Name)> *)pFVar50);
            if (stack0xfffffffffffffb08 != (code *)0x0) {
              (*stack0xfffffffffffffb08)(auStack_508,auStack_508,3);
            }
            newName_00.super_IString.str._M_str = (char *)arguments;
            newName_00.super_IString.str._M_len = (size_t)IVar70.str._M_str;
            pcVar42 = (char *)::wasm::ModuleUtils::copyFunction
                                        ((ModuleUtils *)pFVar32,(Function *)func,
                                         (Module *)IVar70.str._M_len,newName_00);
            NVar66.super_IString.str._M_str = (char *)local_378._0_8_;
            NVar66.super_IString.str._M_len = (size_t)func;
            lVar43 = ::wasm::Module::getExport(NVar66);
            sVar59 = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
            ((IString *)(lVar43 + 0x10))->str = IVar70.str;
            auStack_118 = (undefined1  [8])func;
            pEVar14 = ((Function *)pcVar42)->body;
            if (pEVar14->_id != BlockId) {
              __assert_fail("int(_id) == int(T::SpecificId)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                            ,0x314,"T *wasm::Expression::cast() [T = wasm::Block]");
            }
            uVar52 = 0;
            do {
              puVar47 = (undefined4 *)
                        MixedArena::allocSpace((MixedArena *)((long)auStack_118 + 0x158),0x10,8);
              *puVar47 = 0x16;
              *(undefined8 *)(puVar47 + 2) = 0;
              if (pEVar14[2].type.id <= uVar52) goto LAB_0011b99f;
              *(undefined4 **)(*(long *)(pEVar14 + 2) + uVar52 * 8) = puVar47;
              uVar52 = uVar52 + 1;
            } while (sVar59 != uVar52);
            auStack_f8 = (undefined1  [8])0x0;
            localSets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            localSets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            uVar57 = 0;
            while( true ) {
              uVar52 = ::wasm::Function::getNumLocals();
              uVar26 = WasmCtorEvalOption.field_2._8_8_;
              if (uVar52 <= uVar57) break;
              lVar43 = (ulong)uVar57 * 0x38;
              plVar45 = (long *)(WasmCtorEvalOption.field_2._8_8_ + lVar43);
              auStack_508 = (undefined1  [8])*plVar45;
              ::wasm::Literal::Literal((Literal *)&reader,(Literal *)(plVar45 + 1));
              std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                        ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_4e8,
                         (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                         (uVar26 + lVar43 + 0x20));
              value_00 = anon_unknown.dwarf_4cba5::CtorEvalExternalInterface::getSerialization
                                   ((CtorEvalExternalInterface *)&wasm.tagsMap._M_h._M_single_bucket
                                    ,(Literals *)auStack_508,(Name)ZEXT816(0));
              local_228[0] = ::wasm::Builder::makeLocalSet((Builder *)auStack_118,uVar57,value_00);
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_f8,
                         (Expression **)local_228);
              std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                        ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_4e8);
              ::wasm::Literal::~Literal((Literal *)&reader);
              uVar57 = uVar57 + 1;
            }
            pBVar48 = ::wasm::Builder::
                      makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                                ((Builder *)auStack_118,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 auStack_f8);
            sVar59 = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
            if (pEVar14[2].type.id == 0) {
LAB_0011b99f:
              __assert_fail("index < usedElements",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                            ,0xbc,
                            "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                           );
            }
            **(undefined8 **)(pEVar14 + 2) = pBVar48;
            passes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0x100;
            passes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
            ret.optimizeLevel = 2;
            ret.shrinkLevel = -1;
            ret.inlining.alwaysInlineMaxSize = 0x14;
            ret.inlining.oneCallerInlineMaxSize._0_1_ = 0;
            ret.inlining.partialInliningIfs = 0;
            ret.inlining.flexibleInlineMaxSize = 0;
            ret.inlining.allowFunctionsWithLoops = false;
            ret.inlining._13_3_ = 0;
            ret._32_8_ = &ret.arguments._M_h._M_rehash_policy._M_next_resize;
            ret.arguments._M_h._M_buckets = (__buckets_ptr)0x1;
            ret.arguments._M_h._M_bucket_count = 0;
            ret.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            ret.arguments._M_h._M_element_count._0_4_ = 0x3f800000;
            ret.arguments._M_h._M_rehash_policy._M_max_load_factor = 0.0;
            ret.arguments._M_h._M_rehash_policy._4_4_ = 0;
            ret.arguments._M_h._M_rehash_policy._M_next_resize = 0;
            ret.arguments._M_h._M_single_bucket =
                 (__node_base_ptr)&ret.passesToSkip._M_h._M_rehash_policy._M_next_resize;
            ret.passesToSkip._M_h._M_buckets = (__buckets_ptr)0x1;
            ret.passesToSkip._M_h._M_bucket_count = 0;
            ret.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            ret.passesToSkip._M_h._M_element_count._0_4_ = 0x3f800000;
            ret.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
            ret.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            ret.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 0.0;
            ret.passesToSkip._M_h._M_rehash_policy._4_4_ = 0;
            ret.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
            passes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
            ret.debug = true;
            ret.validate = false;
            ret.validateGlobally = false;
            ret._3_1_ = 0;
            ::wasm::PassRunner::PassRunner
                      ((PassRunner *)auStack_508,
                       (Module *)
                       params.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                       (PassOptions *)
                       &passes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (ret.funcEffectsMap.
                super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ret.funcEffectsMap.
                         super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
            }
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)&ret.arguments._M_h._M_single_bucket);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&ret.ignoreImplicitTraps);
            ::wasm::PassRunner::addDefaultFunctionOptimizationPasses();
            ::wasm::PassRunner::runOnFunction((Function *)auStack_508);
            ::wasm::PassRunner::~PassRunner((PassRunner *)auStack_508);
            if (auStack_f8 != (undefined1  [8])0x0) {
              pcVar42 = (char *)((long)localSets.
                                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_f8
                                );
              operator_delete((void *)auStack_f8,(ulong)pcVar42);
            }
            uVar52 = pEVar33[2].type.id;
          }
          if (uVar52 == sVar59) goto LAB_0011b189;
          local_250 = 0;
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
        ::wasm::Literal::~Literal((Literal *)&results);
        std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::~vector
                  ((vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)
                   ((long)&WasmCtorEvalOption.field_2 + 8));
        *(EvallingModuleRunner **)&((scope.function)->debugLocations)._M_h._M_rehash_policy =
             scope.parent;
        pFVar50 = (Function *)scope.parent;
        std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::~vector
                  ((vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)auStack_368);
      }
      else {
        local_4e8._0_8_ = (pointer)0x0;
        local_4e8._8_8_ = (pointer)0x0;
        stack0xfffffffffffffb08 = (code *)0x0;
        auStack_508 = (undefined1  [8])0x0;
        reader.super_ModuleIOBase.debugInfo = false;
        reader.DWARF = false;
        reader._2_2_ = 0;
        reader.profile = Normal;
        local_4d8 = (element_type *)0x0;
        uStack_a08 = 0;
        if (local_9f8 != CONCAT44(uStack_9fc,local_a00)) {
          local_9f8 = CONCAT44(uStack_9fc,local_a00);
        }
        arguments = (__node_base_ptr *)auStack_208;
        name.super_IString.str._M_str = pcVar11;
        name.super_IString.str._M_len = input.field_2._8_8_;
        ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunctionInternal
                  ((Literals *)auStack_f8,
                   (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                   &keptExportsSet._M_h._M_single_bucket,name,(Literals *)arguments);
        auStack_508 = auStack_f8;
        ::wasm::Literal::operator=((Literal *)&reader,(Literal *)&localSets);
        pFVar50 = local_c8;
        scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_4d8;
        scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_4e8._8_8_;
        auStack_368 = (undefined1  [8])local_4e8._0_8_;
        local_4d8 = (element_type *)local_c8;
        local_4e8._0_8_ = local_d8._M_nxt;
        local_4e8._8_8_ = pLStack_d0;
        local_d8._M_nxt = (_Hash_node_base *)0x0;
        pLStack_d0 = (pointer)0x0;
        local_c8 = (Function *)0x0;
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_368);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&stack0xffffffffffffff28
                  );
        ::wasm::Literal::~Literal((Literal *)&localSets);
        anon_unknown.dwarf_4cba5::CtorEvalExternalInterface::applyToModule
                  ((CtorEvalExternalInterface *)&wasm.tagsMap._M_h._M_single_bucket);
        pcVar42 = auStack_508;
        std::_Optional_payload_base<wasm::Literals>::_Storage<wasm::Literals,false>::
        _Storage<wasm::Literals&>((_Storage<wasm::Literals,false> *)&local_288);
        local_250 = 1;
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_4e8);
        ::wasm::Literal::~Literal((Literal *)&reader);
      }
LAB_0011a820:
      func_00 = &options.enabledFeatures;
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      ::wasm::Literal::~Literal((Literal *)&params);
      if ((local_250 & 1) == 0) goto LAB_0011b2c2;
      if ((anonymous_namespace)::quiet == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  ...success on ",0x10);
        poVar41 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             ((_Alloc_hider *)&((_Base_ptr)pMStack_38)->_M_color)->_M_p,
                             (long)((_Base_ptr)pMStack_38)->_M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar41,".\n",2);
      }
      pcVar42 = (char *)::wasm::IString::interned
                                  (((_Base_ptr)pMStack_38)->_M_parent,
                                   ((_Alloc_hider *)&((_Base_ptr)pMStack_38)->_M_color)->_M_p,0);
      NVar62.super_IString.str._M_str = pcVar42;
      NVar62.super_IString.str._M_len = (size_t)func_00;
      puVar35 = (undefined8 *)::wasm::Module::getExport(NVar62);
      cVar46 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_ab0,(key_type *)pMStack_38);
      if (cVar46.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pcVar42 = (char *)*puVar35;
        NVar64.super_IString.str._M_str = pcVar42;
        NVar64.super_IString.str._M_len = (size_t)func_00;
        ::wasm::Module::removeExport(NVar64);
      }
      else {
        NVar63.super_IString.str._M_str = (char *)puVar35[2];
        NVar63.super_IString.str._M_len = (size_t)func_00;
        this_02 = (ModuleUtils *)::wasm::Module::getFunction(NVar63);
        reader.super_ModuleIOBase.debugInfo = false;
        reader.DWARF = false;
        reader._2_2_ = 0;
        reader.profile = Normal;
        stack0xfffffffffffffb08 =
             std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:72:11)>
             ::_M_manager;
        root.super_IString.str._M_str = auStack_508;
        root.super_IString.str._M_len = *(size_t *)(this_02 + 8);
        auStack_508 = (undefined1  [8])func_00;
        IVar70.str = (string_view)
                     ::wasm::Names::getValidName
                               (*(Names **)this_02,root,(function<bool_(wasm::Name)> *)pFVar50);
        if (stack0xfffffffffffffb08 != (code *)0x0) {
          (*stack0xfffffffffffffb08)(auStack_508,auStack_508,3);
        }
        newName.super_IString.str._M_str = (char *)arguments;
        newName.super_IString.str._M_len = (size_t)IVar70.str._M_str;
        pFVar32 = ::wasm::ModuleUtils::copyFunction
                            (this_02,(Function *)func_00,(Module *)IVar70.str._M_len,newName);
        ::wasm::HeapType::getSignature();
        if (extraout_RDX == 0) {
          pEVar33 = (Expression *)
                    MixedArena::allocSpace
                              ((MixedArena *)&wasm.typeNames._M_h._M_single_bucket,0x10,8);
          pEVar33->_id = NopId;
          (pEVar33->type).id = 0;
        }
        else {
          pEVar33 = anon_unknown.dwarf_4cba5::CtorEvalExternalInterface::getSerialization
                              ((CtorEvalExternalInterface *)&wasm.tagsMap._M_h._M_single_bucket,
                               &local_288._M_value,(Name)ZEXT816(0));
        }
        pFVar32->body = pEVar33;
        pcVar42 = (char *)*puVar35;
        NVar65.super_IString.str._M_str = pcVar42;
        NVar65.super_IString.str._M_len = (size_t)func_00;
        lVar43 = ::wasm::Module::getExport(NVar65);
        ((IString *)(lVar43 + 0x10))->str = IVar70.str;
      }
      std::_Optional_payload_base<wasm::Literals>::_M_reset
                ((_Optional_payload_base<wasm::Literals> *)&local_288._M_value);
      pMStack_38 = (Module *)((long)pMStack_38 + 0x20);
    } while (pMStack_38 != (Module *)local_380._M_nxt);
  }
  ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::~ModuleRunnerBase
            ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
             &keptExportsSet._M_h._M_single_bucket);
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)&PTR__CtorEvalExternalInterface_00152a40;
  std::
  _Rb_tree<wasm::GCData_*,_wasm::GCData_*,_std::_Identity<wasm::GCData_*>,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>
  ::~_Rb_tree((_Rb_tree<wasm::GCData_*,_wasm::GCData_*,_std::_Identity<wasm::GCData_*>,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>
               *)((long)interface.seenDataStack.
                        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                        .fixed.super_FixedStorageBase<wasm::GCData_*,_2UL>.storage._M_elems + 8));
  std::
  _Hashtable<wasm::GCData_*,_std::pair<wasm::GCData_*const,_wasm::Name>,_std::allocator<std::pair<wasm::GCData_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GCData_*>,_std::hash<wasm::GCData_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::GCData_*,_std::pair<wasm::GCData_*const,_wasm::Name>,_std::allocator<std::pair<wasm::GCData_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GCData_*>,_std::hash<wasm::GCData_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&interface.usedGlobalNames._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&interface.memories._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&interface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)interface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
             (_Link_type)pcVar42);
  if (envInstance.
      super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               envInstance.
               super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  interface.seenDataStack.
  super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
  .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&PTR__CtorEvalExternalInterface_00152a40;
  std::
  _Rb_tree<wasm::GCData_*,_wasm::GCData_*,_std::_Identity<wasm::GCData_*>,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>
  ::~_Rb_tree((_Rb_tree<wasm::GCData_*,_wasm::GCData_*,_std::_Identity<wasm::GCData_*>,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>
               *)((long)envInterface.seenDataStack.
                        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                        .fixed.super_FixedStorageBase<wasm::GCData_*,_2UL>.storage._M_elems + 8));
  std::
  _Hashtable<wasm::GCData_*,_std::pair<wasm::GCData_*const,_wasm::Name>,_std::allocator<std::pair<wasm::GCData_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GCData_*>,_std::hash<wasm::GCData_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::GCData_*,_std::pair<wasm::GCData_*const,_wasm::Name>,_std::allocator<std::pair<wasm::GCData_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GCData_*>,_std::hash<wasm::GCData_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&envInterface.usedGlobalNames._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&envInterface.memories._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&envInterface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)envInterface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
             (_Link_type)pcVar42);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&local_b0);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
             (_Link_type)pcVar42);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_ab0);
  cVar28 = ::wasm::WasmValidator::validate
                     ((Module *)&keptExportsSet._M_h._M_single_bucket,(uint)&options.enabledFeatures
                     );
  if (cVar28 != '\0') {
    local_a20 = &uStack_9f0;
    keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)::wasm::Literal::leSI16x8;
    local_a68._M_nxt = (_Hash_node_base *)&wasm.typeNames._M_h._M_single_bucket;
    local_a60 = (__single_object *)0x0;
    uStack_a58 = 0;
    uStack_a57 = 0;
    local_a50 = 0;
    uStack_a4f = 0;
    local_a48 = 0;
    uStack_a47 = 0x101;
    uStack_a44 = 0;
    uStack_a40 = 0;
    uStack_a3c = 2;
    uStack_a38 = 0xffffffff;
    local_a34 = 0x14;
    local_a30._0_4_ = (uint)local_a30 & 0xffffff00;
    uStack_a24 = 0;
    local_a30._4_4_ = 0;
    uStack_a28 = 0;
    local_a18 = 1;
    local_a10 = 0;
    uStack_a08 = 0;
    local_a00 = 0x3f800000;
    local_9f8 = 0;
    uStack_9f0 = 0;
    local_9e8 = &uStack_9b8;
    local_9e0 = 1;
    local_9d8 = 0;
    uStack_9d0 = 0;
    local_9c8 = 0x3f800000;
    local_998 = aCStack_968;
    local_9b0 = 0;
    uStack_9a8 = 0;
    uStack_9a1 = 0;
    local_9c0 = 0;
    uStack_9b8 = 0;
    local_990 = 1;
    local_988 = 0;
    uStack_980 = 0;
    local_978 = 0x3f800000;
    local_970 = 0;
    aCStack_968[0].name._M_dataplus._M_p = (pointer)0x0;
    export_._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
         (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
         &options.enabledFeatures;
    local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"memory-packing","");
    ::wasm::PassRunner::add((PassRunner *)&keptExportsSet._M_h._M_single_bucket,&local_648);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_dataplus._M_p != &local_648.field_2) {
      operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
    }
    local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"remove-unused-names","");
    ::wasm::PassRunner::add((PassRunner *)&keptExportsSet._M_h._M_single_bucket,&local_628);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
    }
    local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"dce","");
    ::wasm::PassRunner::add((PassRunner *)&keptExportsSet._M_h._M_single_bucket,&local_608);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p != &local_608.field_2) {
      operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
    }
    local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"merge-blocks","");
    ::wasm::PassRunner::add((PassRunner *)&keptExportsSet._M_h._M_single_bucket,&local_5e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
      operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
    }
    local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"vacuum","");
    ::wasm::PassRunner::add((PassRunner *)&keptExportsSet._M_h._M_single_bucket,&local_5c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
      operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
    }
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5a8,"remove-unused-module-elements","");
    ::wasm::PassRunner::add((PassRunner *)&keptExportsSet._M_h._M_single_bucket,&local_5a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    ::wasm::PassRunner::run();
    ::wasm::PassRunner::~PassRunner((PassRunner *)&keptExportsSet._M_h._M_single_bucket);
LAB_0011b69b:
    keptExportsSet._M_h._M_single_bucket = &local_a68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&keptExportsSet._M_h._M_single_bucket,"output","");
    cVar49 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&options,(key_type *)&keptExportsSet._M_h._M_single_bucket);
    if (keptExportsSet._M_h._M_single_bucket != &local_a68) {
      operator_delete(keptExportsSet._M_h._M_single_bucket,
                      (ulong)((long)&(local_a68._M_nxt)->_M_nxt + 1));
    }
    if (cVar49._M_node != (_Base_ptr)&options.field_0x8) {
      if (local_1240[0] == (Options)0x1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing...",10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
      }
      local_a68._M_nxt = (_Hash_node_base *)0x0;
      local_a60 = (__single_object *)((ulong)local_a60 & 0xffffffffffffff00);
      local_a50 = SUB81(&uStack_a40,0);
      uStack_a4f = (undefined7)((ulong)&uStack_a40 >> 8);
      local_a48 = 0;
      uStack_a47 = 0;
      uStack_a45 = 0;
      uStack_a44 = 0;
      uStack_a40 = uStack_a40 & 0xffffff00;
      uStack_a28 = 0;
      uStack_a24 = 0;
      local_a20 = (undefined8 *)((ulong)local_a20 & 0xffffffffffffff00);
      keptExportsSet._M_h._M_single_bucket =
           (__node_base_ptr)
           (CONCAT71(CONCAT61((int6)((ulong)keptExportsSet._M_h._M_single_bucket >> 0x10),local_3a),
                     local_39) & 0xffffffffff00ffff);
      interface.seenDataStack.
      super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
      .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&envInterface.wasm;
      export_._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
           (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)&local_a60;
      local_a30 = &local_a20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 ((long)&interface.seenDataStack.
                         super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                         .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),"output","");
      pmVar31 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&options,
                             (key_type *)
                             ((long)&interface.seenDataStack.
                                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
      pcVar4 = (pmVar31->_M_dataplus)._M_p;
      local_588[0] = local_578;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_588,pcVar4,pcVar4 + pmVar31->_M_string_length);
      ::wasm::ModuleWriter::write
                (&keptExportsSet._M_h._M_single_bucket,&options.enabledFeatures,local_588);
      if (local_588[0] != local_578) {
        operator_delete(local_588[0],local_578[0] + 1);
      }
      if ((Module **)
          interface.seenDataStack.
          super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
          .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count != &envInterface.wasm) {
        operator_delete((void *)interface.seenDataStack.
                                super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                                .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (ulong)((long)&((envInterface.wasm)->exports).
                                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if (local_a30 != &local_a20) {
        operator_delete(local_a30,(long)local_a20 + 1);
      }
      if ((uint *)CONCAT71(uStack_a4f,local_a50) != &uStack_a40) {
        operator_delete((uint *)CONCAT71(uStack_a4f,local_a50),CONCAT44(uStack_a3c,uStack_a40) + 1);
      }
      if (export_._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
          super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)&local_a60)
      {
        operator_delete((void *)export_._M_t.
                                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl,
                        (ulong)((long)&(local_a60->_M_t).
                                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                       .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl +
                               1));
      }
    }
    ::wasm::Module::~Module((Module *)&options.enabledFeatures);
    if (local_140 != &input._M_string_length) {
      operator_delete(local_140,input._M_string_length + 1);
    }
    if (options.passOptions.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 options.passOptions.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&options.passOptions.arguments._M_h._M_single_bucket);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&options.passOptions.ignoreImplicitTraps);
    ::wasm::Options::~Options((Options *)local_1240);
    if (local_188 != &WasmCtorEvalOption._M_string_length) {
      operator_delete(local_188,WasmCtorEvalOption._M_string_length + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_2a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_2c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_7b8);
    return 0;
  }
  poVar41 = (ostream *)std::operator<<((ostream *)&std::cout,(Module *)&options.enabledFeatures);
  keptExportsSet._M_h._M_single_bucket =
       (__node_base_ptr)CONCAT71(keptExportsSet._M_h._M_single_bucket._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar41,(char *)&keptExportsSet._M_h._M_single_bucket,1);
  ::wasm::Fatal::Fatal((Fatal *)&keptExportsSet._M_h._M_single_bucket);
  ::wasm::Fatal::operator<<
            ((Fatal *)&keptExportsSet._M_h._M_single_bucket,
             (char (*) [27])"error in validating output");
LAB_0011c389:
  ::wasm::Fatal::~Fatal((Fatal *)&keptExportsSet._M_h._M_single_bucket);
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::vector<std::string> passes;
  bool emitBinary = true;
  bool debugInfo = false;
  String::Split ctors;
  String::Split keptExports;

  const std::string WasmCtorEvalOption = "wasm-ctor-eval options";

  ToolOptions options("wasm-ctor-eval", "Execute code at compile time");
  options
    .add("--output",
         "-o",
         "Output file (stdout if not specified)",
         WasmCtorEvalOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; })
    .add("--ctors",
         "-c",
         "Comma-separated list of global constructor functions to evaluate",
         WasmCtorEvalOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           ctors = String::Split(argument, ",");
         })
    .add(
      "--kept-exports",
      "-ke",
      "Comma-separated list of ctors whose exports we keep around even if we "
      "eval those ctors",
      WasmCtorEvalOption,
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) {
        keptExports = String::Split(argument, ",");
      })
    .add("--ignore-external-input",
         "-ipi",
         "Assumes no env vars are to be read, stdin is empty, etc.",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           ignoreExternalInput = true;
         })
    .add("--quiet",
         "-q",
         "Do not emit verbose logging about the eval process",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { quiet = true; })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  auto input(read_file<std::string>(options.extra["infile"], Flags::Text));

  Module wasm;
  options.applyFeatures(wasm);

  {
    if (options.debug) {
      std::cout << "reading...\n";
    }
    ModuleReader reader;
    try {
      reader.read(options.extra["infile"], wasm);
    } catch (ParseException& p) {
      p.dump(std::cout);
      Fatal() << "error in parsing input";
    }
  }

  if (!WasmValidator().validate(wasm)) {
    std::cout << wasm << '\n';
    Fatal() << "error in validating input";
  }

  if (canEval(wasm)) {
    evalCtors(wasm, ctors, keptExports);

    if (!WasmValidator().validate(wasm)) {
      std::cout << wasm << '\n';
      Fatal() << "error in validating output";
    }

    // Do some useful optimizations after the evalling
    {
      PassRunner passRunner(&wasm);
      passRunner.add("memory-packing"); // we flattened it, so re-optimize
      // TODO: just do -Os for the one function
      passRunner.add("remove-unused-names");
      passRunner.add("dce");
      passRunner.add("merge-blocks");
      passRunner.add("vacuum");
      passRunner.add("remove-unused-module-elements");
      passRunner.run();
    }
  }

  if (options.extra.count("output") > 0) {
    if (options.debug) {
      std::cout << "writing..." << std::endl;
    }
    ModuleWriter writer;
    writer.setBinary(emitBinary);
    writer.setDebugInfo(debugInfo);
    writer.write(wasm, options.extra["output"]);
  }
}